

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_scrollbar(nk_command_buffer *out,nk_flags state,nk_style_scrollbar *style,
                      nk_rect *bounds,nk_rect *scroll)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  uVar2 = state * 2 & 0x20;
  bVar5 = (state & 0x20) == 0;
  lVar4 = 0xa8;
  if (bVar5) {
    lVar4 = (ulong)uVar2 + 0x68;
  }
  uVar3 = 0x40;
  if (bVar5) {
    uVar3 = (ulong)uVar2;
  }
  piVar1 = (int *)((long)&(style->normal).type + uVar3);
  if (*(int *)((long)&(style->normal).type + uVar3) == 0) {
    nk_fill_rect(out,*bounds,style->rounding,*(nk_color *)(piVar1 + 2));
    nk_stroke_rect(out,*bounds,style->rounding,style->border,style->border_color);
  }
  else {
    nk_draw_image(out,*bounds,(nk_image *)(piVar1 + 2),(nk_color)0xffffffff);
  }
  if (*piVar1 != 0) {
    nk_draw_image(out,*scroll,(nk_image *)((long)&(style->normal).data + lVar4),(nk_color)0xffffffff
                 );
    return;
  }
  nk_fill_rect(out,*scroll,style->rounding_cursor,*(nk_color *)((long)&(style->normal).data + lVar4)
              );
  nk_stroke_rect(out,*scroll,style->rounding_cursor,style->border_cursor,style->cursor_border_color)
  ;
  return;
}

Assistant:

NK_INTERN void
nk_draw_scrollbar(struct nk_command_buffer *out, nk_flags state,
    const struct nk_style_scrollbar *style, const struct nk_rect *bounds,
    const struct nk_rect *scroll)
{
    const struct nk_style_item *background;
    const struct nk_style_item *cursor;

    /* select correct colors/images to draw */
    if (state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->active;
        cursor = &style->cursor_active;
    } else if (state & NK_WIDGET_STATE_HOVER) {
        background = &style->hover;
        cursor = &style->cursor_hover;
    } else {
        background = &style->normal;
        cursor = &style->cursor_normal;
    }

    /* draw background */
    if (background->type == NK_STYLE_ITEM_COLOR) {
        nk_fill_rect(out, *bounds, style->rounding, background->data.color);
        nk_stroke_rect(out, *bounds, style->rounding, style->border, style->border_color);
    } else {
        nk_draw_image(out, *bounds, &background->data.image, nk_white);
    }

    /* draw cursor */
    if (background->type == NK_STYLE_ITEM_COLOR) {
        nk_fill_rect(out, *scroll, style->rounding_cursor, cursor->data.color);
        nk_stroke_rect(out, *scroll, style->rounding_cursor, style->border_cursor, style->cursor_border_color);
    } else nk_draw_image(out, *scroll, &cursor->data.image, nk_white);
}